

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_csv.cpp
# Opt level: O2

void __thiscall
duckdb::GlobalWriteCSVData::WriteRows
          (GlobalWriteCSVData *this,const_data_ptr_t data,idx_t size,string *newline)

{
  pointer pFVar1;
  
  ::std::mutex::lock(&this->lock);
  if (this->written_anything == true) {
    pFVar1 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
             operator->(&this->handle);
    FileHandle::Write(pFVar1,(newline->_M_dataplus)._M_p,newline->_M_string_length);
  }
  else {
    this->written_anything = true;
  }
  pFVar1 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator->
                     (&this->handle);
  FileHandle::Write(pFVar1,data,size);
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return;
}

Assistant:

void WriteRows(const_data_ptr_t data, idx_t size, const string &newline) {
		lock_guard<mutex> flock(lock);
		if (written_anything) {
			handle->Write((void *)newline.c_str(), newline.length());
		} else {
			written_anything = true;
		}
		handle->Write((void *)data, size);
	}